

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * mmap_probe(size_t size)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  void *__addr;
  uint uVar5;
  uint uVar6;
  void *unaff_R15;
  
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  uVar5 = 0;
  do {
    __addr = mmap64((void *)mmap_probe::hint_addr,size,3,0x22,-1,0);
    if ((__addr < (void *)0x4000 || (void *)0x7fffffff < __addr) ||
       (0x7fffffff < (long)__addr + size)) {
      if (__addr == (void *)0xffffffffffffffff) {
        if (*piVar4 == 0xc) {
          bVar3 = true;
          unaff_R15 = (void *)0xffffffffffffffff;
          goto LAB_0012c7c1;
        }
      }
      else {
        munmap(__addr,size);
      }
      if (mmap_probe::hint_addr == 0) {
LAB_0012c766:
        if (mmap_probe::hint_prng == 0) {
          mmap_probe::hint_prng = mmap_probe_seed();
        }
        mmap_probe::hint_addr = (ulong)__addr & 0xfffffffffffff000 ^ mmap_probe::hint_addr;
        do {
          mmap_probe::hint_prng = mmap_probe::hint_prng * 0x41c64e6d + 0x3039;
          uVar6 = ((uint)mmap_probe::hint_addr ^ (int)mmap_probe::hint_prng << 0xc) & 0x7fffffff;
          mmap_probe::hint_addr = (uintptr_t)uVar6;
        } while (uVar6 < 0x4000);
        bVar3 = false;
      }
      else {
        if (uVar5 < 5) {
          lVar1 = mmap_probe::hint_addr + size;
          mmap_probe::hint_addr = mmap_probe::hint_addr + 0x1000000;
          if (0x7fffffff < lVar1 + 0x1000000U) {
            mmap_probe::hint_addr = 0;
          }
        }
        else {
          if (uVar5 != 5) goto LAB_0012c766;
          mmap_probe::hint_addr = 0;
        }
        bVar3 = false;
      }
    }
    else {
      mmap_probe::hint_addr = (long)__addr + size;
      *piVar4 = iVar2;
      bVar3 = true;
      unaff_R15 = __addr;
    }
LAB_0012c7c1:
    if (bVar3) {
      return unaff_R15;
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x1e) {
      *piVar4 = iVar2;
      return (void *)0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

static void *mmap_probe(size_t size)
{
  /* Hint for next allocation. Doesn't need to be thread-safe. */
  static uintptr_t hint_addr = 0;
  static uintptr_t hint_prng = 0;
  int olderr = errno;
  int retry;
  for (retry = 0; retry < LJ_ALLOC_MMAP_PROBE_MAX; retry++) {
    void *p = mmap((void *)hint_addr, size, MMAP_PROT, MMAP_FLAGS_PROBE, -1, 0);
    uintptr_t addr = (uintptr_t)p;
    if ((addr >> LJ_ALLOC_MBITS) == 0 && addr >= LJ_ALLOC_MMAP_PROBE_LOWER &&
	((addr + size) >> LJ_ALLOC_MBITS) == 0) {
      /* We got a suitable address. Bump the hint address. */
      hint_addr = addr + size;
      errno = olderr;
      return p;
    }
    if (p != MFAIL) {
      munmap(p, size);
    } else if (errno == ENOMEM) {
      return MFAIL;
    }
    if (hint_addr) {
      /* First, try linear probing. */
      if (retry < LJ_ALLOC_MMAP_PROBE_LINEAR) {
	hint_addr += 0x1000000;
	if (((hint_addr + size) >> LJ_ALLOC_MBITS) != 0)
	  hint_addr = 0;
	continue;
      } else if (retry == LJ_ALLOC_MMAP_PROBE_LINEAR) {
	/* Next, try a no-hint probe to get back an ASLR address. */
	hint_addr = 0;
	continue;
      }
    }
    /* Finally, try pseudo-random probing. */
    if (LJ_UNLIKELY(hint_prng == 0)) {
      hint_prng = mmap_probe_seed();
    }
    /* The unsuitable address we got has some ASLR PRNG bits. */
    hint_addr ^= addr & ~((uintptr_t)(LJ_PAGESIZE-1));
    do {  /* The PRNG itself is very weak, but see above. */
      hint_prng = hint_prng * 1103515245 + 12345;
      hint_addr ^= hint_prng * (uintptr_t)LJ_PAGESIZE;
      hint_addr &= (((uintptr_t)1 << LJ_ALLOC_MBITS)-1);
    } while (hint_addr < LJ_ALLOC_MMAP_PROBE_LOWER);
  }
  errno = olderr;
  return MFAIL;
}